

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O1

ER __thiscall
slang::ast::WhileLoopStatement::evalImpl(WhileLoopStatement *this,EvalContext *context)

{
  bool bVar1;
  ER EVar2;
  ER unaff_EBX;
  int iVar3;
  ConstantValue cv;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_50;
  
  do {
    Expression::eval((ConstantValue *)&local_50,this->cond,context);
    iVar3 = 1;
    if (local_50._M_index == '\0') {
      EVar2 = Fail;
    }
    else {
      bVar1 = ConstantValue::isTrue((ConstantValue *)&local_50);
      if (bVar1) {
        EVar2 = Statement::eval(this->body,context);
        if (EVar2 == Success) {
LAB_008e4691:
          iVar3 = 0;
          EVar2 = unaff_EBX;
        }
        else if (EVar2 == Break) {
          iVar3 = 3;
          EVar2 = unaff_EBX;
        }
        else if (EVar2 == Continue) goto LAB_008e4691;
      }
      else {
        iVar3 = 3;
        EVar2 = unaff_EBX;
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_50);
    unaff_EBX = EVar2;
    if (iVar3 != 0) {
      if (iVar3 != 1) {
        EVar2 = Success;
      }
      return EVar2;
    }
  } while( true );
}

Assistant:

ER WhileLoopStatement::evalImpl(EvalContext& context) const {
    while (true) {
        auto cv = cond.eval(context);
        if (cv.bad())
            return ER::Fail;

        if (!cv.isTrue())
            break;

        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}